

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::anon_unknown_19::load_mvei_headers_intern(istream *in,ImageHeaders *headers)

{
  bool bVar1;
  Exception *pEVar2;
  ulong uVar3;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  undefined4 local_6c;
  int32_t raw_type;
  int32_t channels;
  int32_t height;
  int32_t width;
  allocator local_49;
  string local_48 [37];
  char local_23 [8];
  char signature [11];
  ImageHeaders *headers_local;
  istream *in_local;
  
  signature._3_8_ = headers;
  std::istream::read((char *)in,(long)local_23);
  bVar1 = std::equal<char*,char_const*>(local_23,signature + 3,anon_var_dwarf_2ef18);
  if (!bVar1) {
    height._3_1_ = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Invalid file signature",&local_49);
    util::Exception::Exception(pEVar2,(string *)local_48);
    height._3_1_ = 0;
    __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  std::istream::read((char *)in,(long)&channels);
  std::istream::read((char *)in,(long)&raw_type);
  std::istream::read((char *)in,(long)&local_6c);
  std::istream::read((char *)in,(long)&local_70);
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Error reading headers",&local_91);
    util::Exception::Exception(pEVar2,(string *)local_90);
    __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  *(int32_t *)signature._3_8_ = channels;
  *(int32_t *)(signature._3_8_ + 4) = raw_type;
  *(undefined4 *)(signature._3_8_ + 8) = local_6c;
  *(undefined4 *)(signature._3_8_ + 0xc) = local_70;
  return;
}

Assistant:

void
    load_mvei_headers_intern (std::istream& in, ImageHeaders* headers)
    {
        char signature[MVEI_FILE_SIGNATURE_LEN];
        in.read(signature, MVEI_FILE_SIGNATURE_LEN);
        if (!std::equal(signature, signature + MVEI_FILE_SIGNATURE_LEN,
            MVEI_FILE_SIGNATURE))
            throw util::Exception("Invalid file signature");

        /* Read image headers data, */
        int32_t width, height, channels, raw_type;
        in.read(reinterpret_cast<char*>(&width), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&height), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&channels), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&raw_type), sizeof(int32_t));

        if (!in.good())
            throw util::Exception("Error reading headers");

        headers->width = width;
        headers->height = height;
        headers->channels = channels;
        headers->type = static_cast<ImageType>(raw_type);
    }